

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error client_handle_drag(natwm_state *state,client *client,int16_t x,int16_t y)

{
  uint32_t values [2];
  
  (client->rect).x = x + (client->rect).x;
  (client->rect).y = y + (client->rect).y;
  xcb_configure_window(state->xcb,client->window,3);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_handle_drag(const struct natwm_state *state, struct client *client,
                                    int16_t x, int16_t y)
{
        client->rect.x = (int16_t)(client->rect.x + x);
        client->rect.y = (int16_t)(client->rect.y + y);

        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y;
        uint32_t values[] = {
                (uint32_t)(client->rect.x + state->button_state->monitor_rect->x),
                (uint32_t)(client->rect.y + state->button_state->monitor_rect->y),
        };

        xcb_configure_window(state->xcb, client->window, mask, values);

        return NO_ERROR;
}